

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  undefined1 local_c8 [8];
  string varName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string mask;
  
  GetBitFieldNameForBit_abi_cxx11_((string *)local_48,(java *)(ulong)(uint)bitIndex,bitIndex);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 prefix,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string
            ((string *)local_48,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)&local_68);
  std::operator+(&local_88,"((",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&varName.field_2 + 8),&local_88," & ");
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&varName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(__return_storage_ptr__,&local_68,") != 0)");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(varName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateGetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = "((" + varName + " & " + mask + ") != 0)";
  return result;
}